

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

bool __thiscall amrex::BoxArray::CellEqual(BoxArray *this,BoxArray *rhs)

{
  element_type *__x;
  element_type *__y;
  bool bVar1;
  IntVect IVar2;
  IntVect IVar3;
  
  IVar2 = BATransformer::coarsen_ratio(&this->m_bat);
  IVar3 = BATransformer::coarsen_ratio(&rhs->m_bat);
  if ((IVar2.vect[0] == IVar3.vect[0]) &&
     (IVar2.vect[2] == IVar3.vect[2] && (IVar3.vect._0_8_ ^ IVar2.vect._0_8_) >> 0x20 == 0)) {
    __x = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __y = (rhs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__x == __y) {
      bVar1 = true;
    }
    else {
      bVar1 = std::operator==((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__x,
                              (vector<amrex::Box,_std::allocator<amrex::Box>_> *)__y);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
BoxArray::CellEqual (const BoxArray& rhs) const noexcept
{
    return crseRatio() == rhs.crseRatio()
        && (m_ref == rhs.m_ref || m_ref->m_abox == rhs.m_ref->m_abox);
}